

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.h
# Opt level: O0

int seek_to_sample_coarse(stb_vorbis *f,uint32 sample_number)

{
  code *pcVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  uint32 uVar6;
  uint in_ESI;
  vorb *in_RDI;
  SDL_AssertState sdl_assert_state_3;
  SDL_AssertState sdl_assert_state_2;
  double error;
  double data_bytes;
  SDL_AssertState sdl_assert_state_1;
  SDL_AssertState sdl_assert_state;
  int probe;
  double bytes_per_sample;
  double offset;
  uint32 last_sample_limit;
  uint32 padding;
  uint32 stream_length;
  uint32 delta;
  int page_start;
  int end_pos;
  int start_seg_with_known_loc;
  int i;
  ProbedPage mid;
  ProbedPage right;
  ProbedPage left;
  ProbedPage *in_stack_00000090;
  stb_vorbis *in_stack_00000098;
  undefined4 in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  int in_stack_ffffffffffffff70;
  uint in_stack_ffffffffffffff74;
  stb_vorbis *in_stack_ffffffffffffff78;
  uint in_stack_ffffffffffffff90;
  int iVar7;
  double local_68;
  double local_60;
  uint uVar8;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  int local_3c;
  uint local_38;
  undefined4 uStack_34;
  uint local_30;
  undefined8 local_2c;
  uint local_24;
  undefined8 local_20;
  uint local_18;
  
  local_60 = 0.0;
  local_68 = 0.0;
  iVar7 = 0;
  uVar2 = stb_vorbis_stream_length_in_samples((stb_vorbis *)(ulong)in_stack_ffffffffffffff90);
  if (uVar2 == 0) {
    iVar7 = ::error(in_RDI,VORBIS_seek_without_length);
    return iVar7;
  }
  if (uVar2 < in_ESI) {
    iVar7 = ::error(in_RDI,VORBIS_seek_invalid);
    return iVar7;
  }
  uVar3 = in_RDI->blocksize_1 - in_RDI->blocksize_0 >> 2;
  if (in_ESI < uVar3) {
    uVar8 = 0;
  }
  else {
    uVar8 = in_ESI - uVar3;
  }
  local_20._0_4_ = (in_RDI->p_first).page_start;
  local_20._4_4_ = (in_RDI->p_first).page_end;
  local_18 = (in_RDI->p_first).last_decoded_sample;
  do {
    if (local_18 != 0xffffffff) {
      local_2c._0_4_ = (in_RDI->p_last).page_start;
      local_2c._4_4_ = (in_RDI->p_last).page_end;
      local_24 = (in_RDI->p_last).last_decoded_sample;
      goto LAB_001374c8;
    }
    set_file_offset((stb_vorbis *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),0);
    iVar4 = get_seek_page_info(in_stack_00000098,in_stack_00000090);
  } while (iVar4 != 0);
  goto LAB_00137b3f;
  while (iVar4 = SDL_ReportAssertion(&seek_to_sample_coarse::sdl_assert_data,"seek_to_sample_coarse"
                                     ,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/stb_vorbis.h"
                                     ,0x126f), iVar4 == 0) {
LAB_001374c8:
    if (local_24 != 0xffffffff) goto LAB_00137510;
  }
  if (iVar4 == 1) {
    pcVar1 = (code *)swi(3);
    iVar7 = (*pcVar1)();
    return iVar7;
  }
LAB_00137510:
  if (uVar8 <= local_18) {
    iVar7 = stb_vorbis_seek_start((stb_vorbis *)0x13752c);
    if (iVar7 == 0) {
      return 0;
    }
    if (in_ESI < in_RDI->current_loc) {
      iVar7 = ::error(in_RDI,VORBIS_seek_failed);
      return iVar7;
    }
    return 1;
  }
  while( true ) {
    if (local_20._4_4_ == (uint)local_2c) break;
    do {
      if (local_20._4_4_ < (uint)local_2c) goto LAB_001375e5;
      iVar4 = SDL_ReportAssertion(&seek_to_sample_coarse::sdl_assert_data_1,"seek_to_sample_coarse",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/stb_vorbis.h"
                                  ,0x127c);
    } while (iVar4 == 0);
    if (iVar4 == 1) {
      pcVar1 = (code *)swi(3);
      iVar7 = (*pcVar1)();
      return iVar7;
    }
LAB_001375e5:
    uVar5 = (uint)local_2c - local_20._4_4_;
    if (uVar5 < 0x10001) {
      set_file_offset((stb_vorbis *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),0)
      ;
    }
    else {
      if (iVar7 < 2) {
        if (iVar7 == 0) {
          local_68 = (double)(uint)(local_2c._4_4_ - (int)local_20) / (double)local_24;
          local_60 = local_68 * (double)(uVar8 - local_18) + (double)(local_20 & 0xffffffff);
        }
        else {
          in_stack_ffffffffffffff78 = (stb_vorbis *)(((double)uVar8 - (double)local_30) * local_68);
          if ((0.0 <= (double)in_stack_ffffffffffffff78) &&
             ((double)in_stack_ffffffffffffff78 < 8000.0)) {
            in_stack_ffffffffffffff78 = (stb_vorbis *)0x40bf400000000000;
          }
          if (((double)in_stack_ffffffffffffff78 < 0.0) &&
             (-8000.0 < (double)in_stack_ffffffffffffff78)) {
            in_stack_ffffffffffffff78 = (stb_vorbis *)0xc0bf400000000000;
          }
          local_60 = (double)in_stack_ffffffffffffff78 + (double)in_stack_ffffffffffffff78 +
                     local_60;
        }
        if (local_60 < (double)local_20._4_4_) {
          local_60 = (double)local_20._4_4_;
        }
        if ((double)((uint)local_2c - 0x10000) < local_60) {
          local_60 = (double)((uint)local_2c - 0x10000);
        }
        set_file_offset((stb_vorbis *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                        0);
      }
      else {
        set_file_offset((stb_vorbis *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                        0);
      }
      uVar6 = vorbis_find_page((stb_vorbis *)
                               CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                               (uint32 *)CONCAT44(uVar5,uVar2),(uint32 *)CONCAT44(uVar3,uVar8));
      if (uVar6 == 0) goto LAB_00137b3f;
    }
LAB_001377c8:
    iVar4 = get_seek_page_info(in_stack_00000098,in_stack_00000090);
    if (iVar4 == 0) goto LAB_00137b3f;
    if (local_30 == 0xffffffff) {
      set_file_offset((stb_vorbis *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),0)
      ;
      do {
        if (local_38 < (uint)local_2c) goto LAB_001377c8;
        in_stack_ffffffffffffff74 =
             SDL_ReportAssertion(&seek_to_sample_coarse::sdl_assert_data_2,"seek_to_sample_coarse",
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/stb_vorbis.h"
                                 ,0x12a6);
      } while (in_stack_ffffffffffffff74 == 0);
      if (in_stack_ffffffffffffff74 == 1) {
        pcVar1 = (code *)swi(3);
        iVar7 = (*pcVar1)();
        return iVar7;
      }
      goto LAB_001377c8;
    }
    if (local_38 == (uint)local_2c) {
      if ((1 < iVar7) || (uVar5 < 0x10001)) break;
    }
    else if (uVar8 < local_30) {
      local_2c = CONCAT44(uStack_34,local_38);
      local_24 = local_30;
    }
    else {
      local_20 = CONCAT44(uStack_34,local_38);
      local_18 = local_30;
    }
    iVar7 = iVar7 + 1;
  }
  set_file_offset((stb_vorbis *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),0);
  iVar7 = start_page((vorb *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  if (iVar7 == 0) {
    iVar7 = ::error(in_RDI,VORBIS_seek_failed);
    return iVar7;
  }
  local_3c = in_RDI->end_seg_with_known_loc;
  do {
    if (-1 < local_3c) goto LAB_00137967;
    in_stack_ffffffffffffff70 =
         SDL_ReportAssertion(&seek_to_sample_coarse::sdl_assert_data_3,"seek_to_sample_coarse",
                             "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/stb_vorbis.h"
                             ,0x12bd);
  } while (in_stack_ffffffffffffff70 == 0);
  if (in_stack_ffffffffffffff70 == 1) {
    pcVar1 = (code *)swi(3);
    iVar7 = (*pcVar1)();
    return iVar7;
  }
LAB_00137967:
  while ((iVar7 = local_3c, 0 < local_3c && (in_RDI->segments[local_3c + -1] == 0xff))) {
    local_3c = local_3c + -1;
  }
  if ((0 < local_3c) || ((in_RDI->page_flag & 1) == 0)) {
    in_RDI->current_loc_valid = 0;
    in_RDI->last_seg = 0;
    in_RDI->valid_bits = 0;
    in_RDI->packet_bytes = 0;
    in_RDI->bytes_in_seg = '\0';
    in_RDI->previous_length = 0;
    in_RDI->next_seg = local_3c;
    for (local_3c = 0; local_3c < iVar7; local_3c = local_3c + 1) {
      skip((vorb *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
           in_stack_ffffffffffffff6c);
    }
    iVar7 = vorbis_pump_first_frame
                      ((stb_vorbis *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
    if (iVar7 == 0) {
      return 0;
    }
    if (in_ESI < in_RDI->current_loc) {
      iVar7 = ::error(in_RDI,VORBIS_seek_failed);
      return iVar7;
    }
    return 1;
  }
  iVar7 = go_to_page_before(in_stack_ffffffffffffff78,in_stack_ffffffffffffff74);
  if (iVar7 != 0) {
    stb_vorbis_get_file_offset
              ((stb_vorbis *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    iVar7 = start_page((vorb *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    if (iVar7 == 0) goto LAB_00137b3f;
    local_3c = in_RDI->segment_count + -1;
    goto LAB_00137967;
  }
LAB_00137b3f:
  stb_vorbis_seek_start((stb_vorbis *)0x137b4c);
  iVar7 = ::error(in_RDI,VORBIS_seek_failed);
  return iVar7;
}

Assistant:

static int seek_to_sample_coarse(stb_vorbis *f, uint32 sample_number)
{
   ProbedPage left, right, mid;
   int i, start_seg_with_known_loc, end_pos, page_start;
   uint32 delta, stream_length, padding, last_sample_limit;
   double offset = 0.0, bytes_per_sample = 0.0;
   int probe = 0;

   // find the last page and validate the target sample
   stream_length = stb_vorbis_stream_length_in_samples(f);
   if (stream_length == 0)            return error(f, VORBIS_seek_without_length);
   if (sample_number > stream_length) return error(f, VORBIS_seek_invalid);

   // this is the maximum difference between the window-center (which is the
   // actual granule position value), and the right-start (which the spec
   // indicates should be the granule position (give or take one)).
   padding = ((f->blocksize_1 - f->blocksize_0) >> 2);
   if (sample_number < padding)
      last_sample_limit = 0;
   else
      last_sample_limit = sample_number - padding;

   left = f->p_first;
   while (left.last_decoded_sample == ~0U) {
      // (untested) the first page does not have a 'last_decoded_sample'
      set_file_offset(f, left.page_end);
      if (!get_seek_page_info(f, &left)) goto error;
   }

   right = f->p_last;
   assert(right.last_decoded_sample != ~0U);

   // starting from the start is handled differently
   if (last_sample_limit <= left.last_decoded_sample) {
      if (stb_vorbis_seek_start(f)) {
         if (f->current_loc > sample_number)
            return error(f, VORBIS_seek_failed);
         return 1;
      }
      return 0;
   }

   while (left.page_end != right.page_start) {
      assert(left.page_end < right.page_start);
      // search range in bytes
      delta = right.page_start - left.page_end;
      if (delta <= 65536) {
         // there's only 64K left to search - handle it linearly
         set_file_offset(f, left.page_end);
      } else {
         if (probe < 2) {
            if (probe == 0) {
               // first probe (interpolate)
               double data_bytes = right.page_end - left.page_start;
               bytes_per_sample = data_bytes / right.last_decoded_sample;
               offset = left.page_start + bytes_per_sample * (last_sample_limit - left.last_decoded_sample);
            } else {
               // second probe (try to bound the other side)
               double error = ((double) last_sample_limit - mid.last_decoded_sample) * bytes_per_sample;
               if (error >= 0 && error <  8000) error =  8000;
               if (error <  0 && error > -8000) error = -8000;
               offset += error * 2;
            }

            // ensure the offset is valid
            if (offset < left.page_end)
               offset = left.page_end;
            if (offset > right.page_start - 65536)
               offset = right.page_start - 65536;

            set_file_offset(f, (unsigned int) offset);
         } else {
            // binary search for large ranges (offset by 32K to ensure
            // we don't hit the right page)
            set_file_offset(f, left.page_end + (delta / 2) - 32768);
         }

         if (!vorbis_find_page(f, NULL, NULL)) goto error;
      }

      for (;;) {
         if (!get_seek_page_info(f, &mid)) goto error;
         if (mid.last_decoded_sample != ~0U) break;
         // (untested) no frames end on this page
         set_file_offset(f, mid.page_end);
         assert(mid.page_start < right.page_start);
      }

      // if we've just found the last page again then we're in a tricky file,
      // and we're close enough (if it wasn't an interpolation probe).
      if (mid.page_start == right.page_start) {
         if (probe >= 2 || delta <= 65536)
            break;
      } else {
         if (last_sample_limit < mid.last_decoded_sample)
            right = mid;
         else
            left = mid;
      }

      ++probe;
   }

   // seek back to start of the last packet
   page_start = left.page_start;
   set_file_offset(f, page_start);
   if (!start_page(f)) return error(f, VORBIS_seek_failed);
   end_pos = f->end_seg_with_known_loc;
   assert(end_pos >= 0);

   for (;;) {
      for (i = end_pos; i > 0; --i)
         if (f->segments[i-1] != 255)
            break;

      start_seg_with_known_loc = i;

      if (start_seg_with_known_loc > 0 || !(f->page_flag & PAGEFLAG_continued_packet))
         break;

      // (untested) the final packet begins on an earlier page
      if (!go_to_page_before(f, page_start))
         goto error;

      page_start = stb_vorbis_get_file_offset(f);
      if (!start_page(f)) goto error;
      end_pos = f->segment_count - 1;
   }

   // prepare to start decoding
   f->current_loc_valid = FALSE;
   f->last_seg = FALSE;
   f->valid_bits = 0;
   f->packet_bytes = 0;
   f->bytes_in_seg = 0;
   f->previous_length = 0;
   f->next_seg = start_seg_with_known_loc;

   for (i = 0; i < start_seg_with_known_loc; i++)
      skip(f, f->segments[i]);

   // start decoding (optimizable - this frame is generally discarded)
   if (!vorbis_pump_first_frame(f))
      return 0;
   if (f->current_loc > sample_number)
      return error(f, VORBIS_seek_failed);
   return 1;

error:
   // try to restore the file to a valid state
   stb_vorbis_seek_start(f);
   return error(f, VORBIS_seek_failed);
}